

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileConst(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Reader type;
  Reader source_00;
  Builder target;
  Builder target_00;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  Builder target_01;
  bool bVar2;
  NodeTranslator *this_00;
  uint local_248;
  undefined1 uStack_1a9;
  undefined4 uStack_1a4;
  Builder typeBuilder;
  undefined1 local_170 [96];
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRStack_110;
  UnfinishedValue *local_108;
  WirePointer *pWStack_100;
  AuxNode *local_f8;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRStack_f0;
  undefined1 local_e8 [40];
  ArrayDisposer *pAStack_c0;
  undefined1 local_b8 [40];
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRStack_90;
  SegmentReader *local_88;
  BrandScope *pBStack_80;
  ushort *local_78;
  SegmentBuilder *pSStack_70;
  CapTableBuilder *local_68;
  word *pwStack_60;
  Schema local_58;
  SegmentBuilder *local_50;
  ErrorReporter *pEStack_48;
  BuilderArena *local_40;
  WirePointer *pWStack_38;
  undefined8 local_30;
  
  capnp::schema::Node::Const::Builder::initType(&typeBuilder,&builder);
  Declaration::Const::Reader::getType((Reader *)local_e8,&decl);
  implicitMethodParams.params.reader._44_4_ = uStack_1a4;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_1a9;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  source._reader.capTable = (CapTableReader *)local_e8._8_8_;
  source._reader.segment = (SegmentReader *)local_e8._0_8_;
  source._reader.data = (void *)local_e8._16_8_;
  source._reader.pointers = (WirePointer *)local_e8._24_8_;
  source._reader.dataSize = local_e8._32_4_;
  source._reader.pointerCount = local_e8._36_2_;
  source._reader._38_2_ = local_e8._38_2_;
  source._reader._40_8_ = pAStack_c0;
  target._builder.capTable = typeBuilder._builder.capTable;
  target._builder.segment = typeBuilder._builder.segment;
  target._builder.data = typeBuilder._builder.data;
  target._builder.pointers = typeBuilder._builder.pointers;
  target._builder.dataSize = typeBuilder._builder.dataSize;
  target._builder.pointerCount = typeBuilder._builder.pointerCount;
  target._builder._38_2_ = typeBuilder._builder._38_2_;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  bVar2 = compileType(this,source,target,implicitMethodParams);
  if (bVar2) {
    Declaration::Const::Reader::getValue((Reader *)(local_170 + 0x58),&decl);
    capnp::_::StructBuilder::asReader(&typeBuilder._builder);
    this_00 = (NodeTranslator *)local_170;
    capnp::schema::Node::Const::Builder::initValue((Builder *)this_00,&builder);
    type._reader.capTable = (CapTableReader *)local_170._48_8_;
    type._reader.segment = (SegmentReader *)local_170._40_8_;
    type._reader.data = (void *)local_170._56_8_;
    type._reader.pointers = (WirePointer *)local_170._64_8_;
    type._reader.dataSize = local_170._72_4_;
    type._reader.pointerCount = local_170._76_2_;
    type._reader._38_2_ = local_170._78_2_;
    type._reader._40_8_ = local_170._80_8_;
    target_00._builder.capTable = (CapTableBuilder *)local_170._8_8_;
    target_00._builder.segment = (SegmentBuilder *)local_170._0_8_;
    target_00._builder.data = (void *)local_170._16_8_;
    target_00._builder.pointers = (WirePointer *)local_170._24_8_;
    target_00._builder.dataSize = local_170._32_4_;
    target_00._builder.pointerCount = local_170._36_2_;
    target_00._builder._38_2_ = local_170._38_2_;
    compileDefaultDefaultValue(this_00,type,target_00);
    local_248 = (uint)local_170._72_8_;
    if (((local_248 < 0x10) || (0x12 < *(ushort *)local_170._56_8_)) ||
       ((0x74000U >> (*(ushort *)local_170._56_8_ & 0x1f) & 1) == 0)) {
      source_00._reader.capTable = (CapTableReader *)pRStack_110;
      source_00._reader.segment = (SegmentReader *)local_170._88_8_;
      source_00._reader.data = local_108;
      source_00._reader.pointers = pWStack_100;
      source_00._reader._32_8_ = local_f8;
      source_00._reader._40_8_ = pRStack_f0;
      type_00._reader.capTable = (CapTableReader *)local_170._48_8_;
      type_00._reader.segment = (SegmentReader *)local_170._40_8_;
      type_00._reader.data = (void *)local_170._56_8_;
      type_00._reader.pointers = (WirePointer *)local_170._64_8_;
      type_00._reader.dataSize = local_170._72_4_;
      type_00._reader.pointerCount = local_170._76_2_;
      type_00._reader._38_2_ = local_170._78_2_;
      type_00._reader._40_8_ = local_170._80_8_;
      target_01._builder.capTable = (CapTableBuilder *)local_170._8_8_;
      target_01._builder.segment = (SegmentBuilder *)local_170._0_8_;
      target_01._builder.data = (void *)local_170._16_8_;
      target_01._builder.pointers = (WirePointer *)local_170._24_8_;
      target_01._builder.dataSize = local_170._32_4_;
      target_01._builder.pointerCount = local_170._36_2_;
      target_01._builder._38_2_ = local_170._38_2_;
      compileValue(this,source_00,type_00,(Schema)0x30c7a8,target_01,true);
    }
    else {
      local_b8._32_8_ = local_f8;
      pRStack_90 = pRStack_f0;
      local_b8._16_8_ = local_108;
      local_b8._24_8_ = pWStack_100;
      local_b8._0_8_ = local_170._88_8_;
      local_b8._8_8_ = pRStack_110;
      local_88 = (SegmentReader *)local_170._40_8_;
      pBStack_80 = (BrandScope *)local_170._48_8_;
      local_78 = (ushort *)local_170._56_8_;
      pSStack_70 = (SegmentBuilder *)local_170._64_8_;
      local_68 = (CapTableBuilder *)local_170._72_8_;
      pwStack_60 = (word *)local_170._80_8_;
      local_58.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
      local_50 = (SegmentBuilder *)local_170._0_8_;
      pEStack_48 = (ErrorReporter *)local_170._8_8_;
      local_40 = (BuilderArena *)local_170._16_8_;
      pWStack_38 = (WirePointer *)local_170._24_8_;
      local_30 = local_170._32_8_;
      kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::
      add<capnp::compiler::NodeTranslator::UnfinishedValue>
                (&this->unfinishedValues,(UnfinishedValue *)local_b8);
    }
  }
  return;
}

Assistant:

void NodeTranslator::compileConst(Declaration::Const::Reader decl,
                                  schema::Node::Const::Builder builder) {
  auto typeBuilder = builder.initType();
  if (compileType(decl.getType(), typeBuilder, noImplicitParams())) {
    compileBootstrapValue(decl.getValue(), typeBuilder.asReader(), builder.initValue());
  }
}